

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoods
          (BeagleCPUImpl<double,_1,_0> *this,int bufferIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  double *in_R9;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int i_4;
  int i_3;
  double *cumulativeScaleFactors;
  int i_2;
  double sum;
  int k_2;
  int i_1;
  int k_1;
  int l;
  int i;
  int k;
  int v;
  int u;
  double *freqs;
  double *wt;
  double *rootPartials;
  int returnCode;
  int local_80;
  int local_7c;
  int local_6c;
  double local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_24;
  
  local_24 = 0;
  lVar1 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)in_ESI * 8);
  pdVar2 = *(double **)(*(long *)(in_RDI + 0xa0) + (long)in_EDX * 8);
  lVar3 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)in_ECX * 8);
  local_44 = 0;
  local_48 = 0;
  for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x14); local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x24); local_50 = local_50 + 1) {
      *(double *)(*(long *)(in_RDI + 0xe0) + (long)local_44 * 8) =
           *(double *)(lVar1 + (long)local_48 * 8) * *pdVar2;
      local_44 = local_44 + 1;
      local_48 = local_48 + 1;
    }
  }
  for (local_54 = 1; local_54 < *(int *)(in_RDI + 0x34); local_54 = local_54 + 1) {
    local_44 = 0;
    for (local_58 = 0; local_58 < *(int *)(in_RDI + 0x14); local_58 = local_58 + 1) {
      for (local_5c = 0; local_5c < *(int *)(in_RDI + 0x24); local_5c = local_5c + 1) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)(lVar1 + (long)local_48 * 8);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = pdVar2[local_54];
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_44 * 8);
        auVar5 = vfmadd213sd_fma(auVar5,auVar8,auVar11);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_44 * 8) = auVar5._0_8_;
        local_44 = local_44 + 1;
        local_48 = local_48 + 1;
      }
    }
  }
  local_44 = 0;
  for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x14); local_60 = local_60 + 1) {
    local_68 = 0.0;
    for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x24); local_6c = local_6c + 1) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(lVar3 + (long)local_6c * 8);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_44 * 8);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_68;
      auVar5 = vfmadd213sd_fma(auVar6,auVar9,auVar12);
      local_68 = auVar5._0_8_;
      local_44 = local_44 + 1;
    }
    dVar4 = log(local_68);
    *(double *)(*(long *)(in_RDI + 0x110) + (long)local_60 * 8) = dVar4;
  }
  if (-1 < in_R8D) {
    lVar1 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)in_R8D * 8);
    for (local_7c = 0; local_7c < *(int *)(in_RDI + 0x14); local_7c = local_7c + 1) {
      *(double *)(*(long *)(in_RDI + 0x110) + (long)local_7c * 8) =
           *(double *)(lVar1 + (long)local_7c * 8) +
           *(double *)(*(long *)(in_RDI + 0x110) + (long)local_7c * 8);
    }
  }
  *in_R9 = 0.0;
  for (local_80 = 0; local_80 < *(int *)(in_RDI + 0x14); local_80 = local_80 + 1) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x110) + (long)local_80 * 8);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_80 * 8);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *in_R9;
    auVar5 = vfmadd213sd_fma(auVar7,auVar10,auVar13);
    *in_R9 = auVar5._0_8_;
  }
  if ((*in_R9 != *in_R9) || (NAN(*in_R9) || NAN(*in_R9))) {
    local_24 = -8;
  }
  return local_24;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoods(const int bufferIndex,
                            const int categoryWeightsIndex,
                            const int stateFrequenciesIndex,
                            const int scalingFactorsIndex,
                            double* outSumLogLikelihood) {

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];
    int u = 0;
    int v = 0;
    for (int k = 0; k < kPatternCount; k++) {
        for (int i = 0; i < kStateCount; i++) {
            integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
            u++;
            v++;
        }
        v += P_PAD;
    }
    for (int l = 1; l < kCategoryCount; l++) {
        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                u++;
                v++;
            }
            v += P_PAD;
        }
    }
    u = 0;
    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE sum = 0.0;
        for (int i = 0; i < kStateCount; i++) {
            sum += freqs[i] * integrationTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sum);
    }

    if (scalingFactorsIndex >= 0) {
        const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
        for(int i=0; i<kPatternCount; i++) {
            outLogLikelihoodsTmp[i] += cumulativeScaleFactors[i];
        }
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    // TODO: merge the three kPatternCount loops above into one

    return returnCode;
}